

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O1

void __thiscall gui::Slider::Slider(Slider *this,shared_ptr<gui::SliderStyle> *style,String *name)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  Widget::Widget(&this->super_Widget,name);
  (this->super_Widget).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Slider_0027e028;
  (this->onValueChange).enabled_ = true;
  p_Var1 = &(this->onValueChange).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onValueChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onValueChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->onValueChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onValueChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onValueChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->style_).super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (style->super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (style->super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->style_).super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->styleCopied_ = false;
  (this->size_).x = 0.0;
  (this->size_).y = 0.0;
  (this->label_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->label_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->range_).first = 0.0;
  (this->range_).second = 1.0;
  this->value_ = 0.0;
  this->step_ = 0.0;
  this->isDragging_ = false;
  return;
}

Assistant:

Slider::Slider(std::shared_ptr<SliderStyle> style, const sf::String& name) :
    baseClass(name),
    style_(style),
    styleCopied_(false),
    size_(0.0f, 0.0f),
    label_(nullptr),
    range_(0.0f, 1.0f),
    value_(0.0f),
    step_(0.0f),
    isDragging_(false) {
}